

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGhsMultiGenerator::GenerateTargetsDepthFirst
          (cmLocalGhsMultiGenerator *this,cmGeneratorTarget *target,
          vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *remaining)

{
  bool bVar1;
  TargetType TVar2;
  iterator __first;
  iterator __last;
  reference ppcVar3;
  undefined1 local_130 [8];
  cmGhsMultiTargetGenerator tg;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_28;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  it;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *remaining_local;
  cmGeneratorTarget *target_local;
  cmLocalGhsMultiGenerator *this_local;
  
  it._M_current = (cmGeneratorTarget **)remaining;
  remaining_local = (vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)target;
  target_local = (cmGeneratorTarget *)this;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != INTERFACE_LIBRARY) {
    __first = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                        (it._M_current);
    __last = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                       (it._M_current);
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,cmGeneratorTarget*>
                         (__first._M_current,__last._M_current,
                          (cmGeneratorTarget **)&remaining_local);
    tg._232_8_ = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                           ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                            it._M_current);
    bVar1 = __gnu_cxx::operator==
                      (&local_28,
                       (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                        *)&tg.CmdWindowsShell);
    if (!bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_28);
      *ppcVar3 = (cmGeneratorTarget *)0x0;
      cmGhsMultiTargetGenerator::cmGhsMultiTargetGenerator
                ((cmGhsMultiTargetGenerator *)local_130,(cmGeneratorTarget *)remaining_local);
      cmGhsMultiTargetGenerator::Generate((cmGhsMultiTargetGenerator *)local_130);
      cmGhsMultiTargetGenerator::~cmGhsMultiTargetGenerator((cmGhsMultiTargetGenerator *)local_130);
    }
  }
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::GenerateTargetsDepthFirst(
  cmGeneratorTarget* target, std::vector<cmGeneratorTarget*>& remaining)
{
  if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return;
  }
  // Find this target in the list of remaining targets.
  auto it = std::find(remaining.begin(), remaining.end(), target);
  if (it == remaining.end()) {
    // This target was already handled.
    return;
  }
  // Remove this target from the list of remaining targets because
  // we are handling it now.
  *it = nullptr;

  cmGhsMultiTargetGenerator tg(target);
  tg.Generate();
}